

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Type __thiscall capnp::ConstSchema::getType(ConstSchema *this)

{
  Reader proto;
  Type TVar1;
  Reader local_a8;
  Reader local_70;
  Reader local_40;
  
  Schema::getProto(&local_70,&this->super_Schema);
  local_a8._reader.dataSize = local_70._reader.dataSize;
  local_a8._reader.pointerCount = local_70._reader.pointerCount;
  local_a8._reader._38_2_ = local_70._reader._38_2_;
  local_a8._reader.nestingLimit = local_70._reader.nestingLimit;
  local_a8._reader._44_4_ = local_70._reader._44_4_;
  local_a8._reader.data = local_70._reader.data;
  local_a8._reader.pointers = local_70._reader.pointers;
  local_a8._reader.segment = local_70._reader.segment;
  local_a8._reader.capTable = local_70._reader.capTable;
  capnp::schema::Node::Const::Reader::getType(&local_40,&local_a8);
  proto._reader.capTable = local_40._reader.capTable;
  proto._reader.segment = local_40._reader.segment;
  proto._reader.data = local_40._reader.data;
  proto._reader.pointers = local_40._reader.pointers;
  proto._reader.dataSize = local_40._reader.dataSize;
  proto._reader.pointerCount = local_40._reader.pointerCount;
  proto._reader._38_2_ = local_40._reader._38_2_;
  proto._reader.nestingLimit = local_40._reader.nestingLimit;
  proto._reader._44_4_ = local_40._reader._44_4_;
  TVar1 = Schema::interpretType(&this->super_Schema,proto,0x5000000);
  return TVar1;
}

Assistant:

Type ConstSchema::getType() const {
  return interpretType(getProto().getConst().getType(),
      _::RawBrandedSchema::makeDepLocation(_::RawBrandedSchema::DepKind::CONST_TYPE, 0));
}